

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O0

bool woff2::ReadGlyph(uint8_t *data,size_t len,Glyph *glyph)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  size_t sVar6;
  size_type sVar7;
  reference pvVar8;
  byte *pbVar9;
  reference pvVar10;
  int16_t local_d2;
  int local_d0;
  int16_t y_delta_1;
  int sign_1;
  uint8_t y_delta;
  uint8_t flag_2;
  size_t j_2;
  int local_b8;
  int i_3;
  int prev_y;
  int16_t x_delta_1;
  int sign;
  uint8_t x_delta;
  uint8_t flag_1;
  size_t j_1;
  int local_98;
  int i_2;
  int prev_x;
  size_t j;
  uint8_t local_7e;
  byte local_7d;
  int i_1;
  uint8_t flag_repeat;
  uint8_t flag;
  allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_69;
  undefined1 local_68 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  flags;
  int local_48;
  uint16_t num_points;
  uint16_t point_index;
  int i;
  uint16_t last_point_index;
  int16_t num_contours;
  Buffer buffer;
  Glyph *glyph_local;
  size_t len_local;
  uint8_t *data_local;
  
  buffer.offset_ = (size_t)glyph;
  Buffer::Buffer((Buffer *)&i,data,len);
  bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)&point_index);
  if (bVar3) {
    bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)buffer.offset_);
    if ((((bVar3) && (bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)(buffer.offset_ + 4)), bVar3))
        && (bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)(buffer.offset_ + 2)), bVar3)) &&
       (bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)(buffer.offset_ + 6)), bVar3)) {
      if (point_index == 0) {
        data_local._7_1_ = 1;
      }
      else {
        if ((short)point_index < 1) {
          if (point_index != 0xffff) {
            data_local._7_1_ = 0;
            goto LAB_0012f0ce;
          }
          bVar3 = ReadCompositeGlyphData((Buffer *)&i,(Glyph *)buffer.offset_);
          if (!bVar3) {
            data_local._7_1_ = 0;
            goto LAB_0012f0ce;
          }
          if ((*(byte *)(buffer.offset_ + 0x3c) & 1) == 0) {
            *(undefined2 *)(buffer.offset_ + 8) = 0;
          }
          else {
            bVar3 = Buffer::ReadU16((Buffer *)&i,(uint16_t *)(buffer.offset_ + 8));
            if (!bVar3) {
              data_local._7_1_ = 0;
              goto LAB_0012f0ce;
            }
            sVar6 = Buffer::offset((Buffer *)&i);
            *(uint8_t **)(buffer.offset_ + 0x10) = data + sVar6;
            bVar3 = Buffer::Skip((Buffer *)&i,(ulong)*(ushort *)(buffer.offset_ + 8));
            if (!bVar3) {
              data_local._7_1_ = 0;
              goto LAB_0012f0ce;
            }
          }
        }
        else {
          std::
          vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
          ::resize((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                    *)(buffer.offset_ + 0x18),(long)(short)point_index);
          num_points = 0;
          for (local_48 = 0; local_48 < (short)point_index; local_48 = local_48 + 1) {
            bVar3 = Buffer::ReadU16((Buffer *)&i,
                                    (uint16_t *)
                                    ((long)&flags.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 6))
            ;
            if (!bVar3) {
              data_local._7_1_ = 0;
              goto LAB_0012f0ce;
            }
            flags.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ =
                 (flags.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_ - num_points) +
                 (ushort)(local_48 == 0);
            pvVar5 = std::
                     vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                     ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                   *)(buffer.offset_ + 0x18),(long)local_48);
            std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::resize
                      (pvVar5,(ulong)flags.
                                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_);
            num_points = flags.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
          }
          bVar3 = Buffer::ReadU16((Buffer *)&i,(uint16_t *)(buffer.offset_ + 8));
          if (!bVar3) {
            data_local._7_1_ = 0;
            goto LAB_0012f0ce;
          }
          sVar6 = Buffer::offset((Buffer *)&i);
          *(uint8_t **)(buffer.offset_ + 0x10) = data + sVar6;
          bVar3 = Buffer::Skip((Buffer *)&i,(ulong)*(ushort *)(buffer.offset_ + 8));
          if (!bVar3) {
            data_local._7_1_ = 0;
            goto LAB_0012f0ce;
          }
          sVar7 = (size_type)(short)point_index;
          std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                    (&local_69);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_68,sVar7,&local_69);
          std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                    (&local_69);
          local_7d = 0;
          local_7e = '\0';
          for (j._4_4_ = 0; j._4_4_ < (short)point_index; j._4_4_ = j._4_4_ + 1) {
            pvVar8 = std::
                     vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_68,(long)j._4_4_);
            pvVar5 = std::
                     vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                     ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                   *)(buffer.offset_ + 0x18),(long)j._4_4_);
            sVar7 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::size
                              (pvVar5);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar8,sVar7);
            _prev_x = 0;
            while( true ) {
              uVar2 = _prev_x;
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j._4_4_);
              sVar7 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::size
                                (pvVar5);
              if (sVar7 <= uVar2) break;
              if (local_7e == '\0') {
                bVar3 = Buffer::ReadU8((Buffer *)&i,&local_7d);
                if (!bVar3) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
                if (((local_7d & 8) != 0) &&
                   (bVar3 = Buffer::ReadU8((Buffer *)&i,&local_7e), !bVar3)) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
              }
              else {
                local_7e = local_7e + 0xff;
              }
              bVar1 = local_7d;
              pvVar8 = std::
                       vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     *)local_68,(long)j._4_4_);
              pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (pvVar8,_prev_x);
              *pbVar9 = bVar1;
              bVar1 = local_7d & 1;
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j._4_4_);
              pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                        operator[](pvVar5,_prev_x);
              pvVar10->on_curve = bVar1 != 0;
              _prev_x = _prev_x + 1;
            }
          }
          local_98 = 0;
          for (j_1._4_4_ = 0; j_1._4_4_ < (short)point_index; j_1._4_4_ = j_1._4_4_ + 1) {
            _sign = 0;
            while( true ) {
              uVar2 = _sign;
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j_1._4_4_);
              sVar7 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::size
                                (pvVar5);
              if (sVar7 <= uVar2) break;
              pvVar8 = std::
                       vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     *)local_68,(long)j_1._4_4_);
              pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (pvVar8,_sign);
              x_delta_1._1_1_ = *pbVar9;
              if ((x_delta_1._1_1_ & 2) == 0) {
                i_3._2_2_ = 0;
                if (((x_delta_1._1_1_ & 0x10) == 0) &&
                   (bVar3 = Buffer::ReadS16((Buffer *)&i,(int16_t *)((long)&i_3 + 2)), !bVar3)) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
                iVar4 = local_98 + i_3._2_2_;
                pvVar5 = std::
                         vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                       *)(buffer.offset_ + 0x18),(long)j_1._4_4_);
                pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                          operator[](pvVar5,_sign);
                pvVar10->x = iVar4;
              }
              else {
                bVar3 = Buffer::ReadU8((Buffer *)&i,(uint8_t *)&x_delta_1);
                if (!bVar3) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
                prev_y = -1;
                if ((x_delta_1._1_1_ & 0x10) != 0) {
                  prev_y = 1;
                }
                iVar4 = local_98 + prev_y * (uint)(byte)x_delta_1;
                pvVar5 = std::
                         vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                       *)(buffer.offset_ + 0x18),(long)j_1._4_4_);
                pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                          operator[](pvVar5,_sign);
                pvVar10->x = iVar4;
              }
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j_1._4_4_);
              pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                        operator[](pvVar5,_sign);
              local_98 = pvVar10->x;
              _sign = _sign + 1;
            }
          }
          local_b8 = 0;
          for (j_2._4_4_ = 0; j_2._4_4_ < (short)point_index; j_2._4_4_ = j_2._4_4_ + 1) {
            _sign_1 = 0;
            while( true ) {
              uVar2 = _sign_1;
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j_2._4_4_);
              sVar7 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::size
                                (pvVar5);
              if (sVar7 <= uVar2) break;
              pvVar8 = std::
                       vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                     *)local_68,(long)j_2._4_4_);
              pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 (pvVar8,_sign_1);
              y_delta_1._1_1_ = *pbVar9;
              if ((y_delta_1._1_1_ & 4) == 0) {
                local_d2 = 0;
                if (((y_delta_1._1_1_ & 0x20) == 0) &&
                   (bVar3 = Buffer::ReadS16((Buffer *)&i,&local_d2), !bVar3)) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
                iVar4 = local_b8 + local_d2;
                pvVar5 = std::
                         vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                       *)(buffer.offset_ + 0x18),(long)j_2._4_4_);
                pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                          operator[](pvVar5,_sign_1);
                pvVar10->y = iVar4;
              }
              else {
                bVar3 = Buffer::ReadU8((Buffer *)&i,(uint8_t *)&y_delta_1);
                if (!bVar3) {
                  data_local._7_1_ = 0;
                  i_2 = 1;
                  goto LAB_0012f006;
                }
                local_d0 = -1;
                if ((y_delta_1._1_1_ & 0x20) != 0) {
                  local_d0 = 1;
                }
                iVar4 = local_b8 + local_d0 * (uint)(byte)y_delta_1;
                pvVar5 = std::
                         vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                         ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                       *)(buffer.offset_ + 0x18),(long)j_2._4_4_);
                pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                          operator[](pvVar5,_sign_1);
                pvVar10->y = iVar4;
              }
              pvVar5 = std::
                       vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                       ::operator[]((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     *)(buffer.offset_ + 0x18),(long)j_2._4_4_);
              pvVar10 = std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>::
                        operator[](pvVar5,_sign_1);
              local_b8 = pvVar10->y;
              _sign_1 = _sign_1 + 1;
            }
          }
          i_2 = 0;
LAB_0012f006:
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)local_68);
          if (i_2 != 0) goto LAB_0012f0ce;
        }
        data_local._7_1_ = 1;
      }
    }
    else {
      data_local._7_1_ = 0;
    }
  }
  else {
    data_local._7_1_ = 0;
  }
LAB_0012f0ce:
  return (bool)(data_local._7_1_ & 1);
}

Assistant:

bool ReadGlyph(const uint8_t* data, size_t len, Glyph* glyph) {
  Buffer buffer(data, len);

  int16_t num_contours;
  if (!buffer.ReadS16(&num_contours)) {
    return FONT_COMPRESSION_FAILURE();
  }

  // Read the bounding box.
  if (!buffer.ReadS16(&glyph->x_min) ||
      !buffer.ReadS16(&glyph->y_min) ||
      !buffer.ReadS16(&glyph->x_max) ||
      !buffer.ReadS16(&glyph->y_max)) {
    return FONT_COMPRESSION_FAILURE();
  }

  if (num_contours == 0) {
    // Empty glyph.
    return true;
  }

  if (num_contours > 0) {
    // Simple glyph.
    glyph->contours.resize(num_contours);

    // Read the number of points per contour.
    uint16_t last_point_index = 0;
    for (int i = 0; i < num_contours; ++i) {
      uint16_t point_index;
      if (!buffer.ReadU16(&point_index)) {
        return FONT_COMPRESSION_FAILURE();
      }
      uint16_t num_points = point_index - last_point_index + (i == 0 ? 1 : 0);
      glyph->contours[i].resize(num_points);
      last_point_index = point_index;
    }

    // Read the instructions.
    if (!buffer.ReadU16(&glyph->instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    glyph->instructions_data = data + buffer.offset();
    if (!buffer.Skip(glyph->instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }

    // Read the run-length coded flags.
    std::vector<std::vector<uint8_t> > flags(num_contours);
    {
      uint8_t flag = 0;
      uint8_t flag_repeat = 0;
      for (int i = 0; i < num_contours; ++i) {
        flags[i].resize(glyph->contours[i].size());
        for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
          if (flag_repeat == 0) {
            if (!buffer.ReadU8(&flag)) {
              return FONT_COMPRESSION_FAILURE();
            }
            if (flag & kFLAG_REPEAT) {
              if (!buffer.ReadU8(&flag_repeat)) {
                return FONT_COMPRESSION_FAILURE();
              }
            }
          } else {
            flag_repeat--;
          }
          flags[i][j] = flag;
          glyph->contours[i][j].on_curve = flag & kFLAG_ONCURVE;
        }
      }
    }

    // Read the x coordinates.
    int prev_x = 0;
    for (int i = 0; i < num_contours; ++i) {
      for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
        uint8_t flag = flags[i][j];
        if (flag & kFLAG_XSHORT) {
          // single byte x-delta coord value
          uint8_t x_delta;
          if (!buffer.ReadU8(&x_delta)) {
            return FONT_COMPRESSION_FAILURE();
          }
          int sign = (flag & kFLAG_XREPEATSIGN) ? 1 : -1;
          glyph->contours[i][j].x = prev_x + sign * x_delta;
        } else {
          // double byte x-delta coord value
          int16_t x_delta = 0;
          if (!(flag & kFLAG_XREPEATSIGN)) {
            if (!buffer.ReadS16(&x_delta)) {
              return FONT_COMPRESSION_FAILURE();
            }
          }
          glyph->contours[i][j].x = prev_x + x_delta;
        }
        prev_x = glyph->contours[i][j].x;
      }
    }

    // Read the y coordinates.
    int prev_y = 0;
    for (int i = 0; i < num_contours; ++i) {
      for (size_t j = 0; j < glyph->contours[i].size(); ++j) {
        uint8_t flag = flags[i][j];
        if (flag & kFLAG_YSHORT) {
          // single byte y-delta coord value
          uint8_t y_delta;
          if (!buffer.ReadU8(&y_delta)) {
            return FONT_COMPRESSION_FAILURE();
          }
          int sign = (flag & kFLAG_YREPEATSIGN) ? 1 : -1;
          glyph->contours[i][j].y = prev_y + sign * y_delta;
        } else {
          // double byte y-delta coord value
          int16_t y_delta = 0;
          if (!(flag & kFLAG_YREPEATSIGN)) {
            if (!buffer.ReadS16(&y_delta)) {
              return FONT_COMPRESSION_FAILURE();
            }
          }
          glyph->contours[i][j].y = prev_y + y_delta;
        }
        prev_y = glyph->contours[i][j].y;
      }
    }
  } else if (num_contours == -1) {
    // Composite glyph.
    if (!ReadCompositeGlyphData(&buffer, glyph)) {
      return FONT_COMPRESSION_FAILURE();
    }
    // Read the instructions.
    if (glyph->have_instructions) {
      if (!buffer.ReadU16(&glyph->instructions_size)) {
        return FONT_COMPRESSION_FAILURE();
      }
      glyph->instructions_data = data + buffer.offset();
      if (!buffer.Skip(glyph->instructions_size)) {
        return FONT_COMPRESSION_FAILURE();
      }
    } else {
      glyph->instructions_size = 0;
    }
  } else {
    return FONT_COMPRESSION_FAILURE();
  }
  return true;
}